

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O0

void etdc_print(etdc_table *table)

{
  uint *in_RDI;
  int j;
  int i;
  etdc_table *s;
  uint local_18;
  int local_14;
  uint *local_10;
  
  fprintf(_stderr,"Printing table");
  local_18 = 0;
  for (local_10 = in_RDI; local_10 != (uint *)0x0; local_10 = *(uint **)(local_10 + 10)) {
    printf("symbol %u: freq %d\n",(ulong)*local_10,(ulong)local_10[1]);
    printf("rank: %u code: ",(ulong)local_18);
    for (local_14 = 0; local_14 < (int)local_10[4]; local_14 = local_14 + 1) {
      printf("%u ",(ulong)*(byte *)((long)local_10 + (long)local_14 + 8));
    }
    printf("\n");
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void etdc_print(struct etdc_table *table) {
    struct etdc_table *s;
    int i, j;

    fprintf(stderr, "Printing table");
    for(s=(struct etdc_table*)table, j=0; s != (struct etdc_table*)NULL; s=(struct etdc_table*)s->hh.next, j++) {
        printf("symbol %u: freq %d\n", s->symbol, s->freq);

	printf("rank: %u code: ", j);
	for ( i = 0; i < s->size; i++) {
	  printf("%u ", s->code[i]); 
	}
	printf("\n");
    }
}